

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_avx2::forward_inplace(Mish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  void *pvVar13;
  int iVar14;
  undefined1 (*pauVar15) [32];
  int _c;
  int iVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  Mat local_78;
  
  iVar16 = bottom_top_blob->c;
  iVar18 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  iVar14 = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar18 < 1) {
      iVar18 = _c;
    }
    if (iVar16 < 1) {
      iVar16 = iVar14;
    }
    auVar25._8_4_ = 0x807fffff;
    auVar25._0_8_ = 0x807fffff807fffff;
    auVar25._12_4_ = 0x807fffff;
    auVar25._16_4_ = 0x807fffff;
    auVar25._20_4_ = 0x807fffff;
    auVar25._24_4_ = 0x807fffff;
    auVar25._28_4_ = 0x807fffff;
    for (; _c != iVar16; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar15 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar60._16_4_ = 0x3f800000;
      auVar60._20_4_ = 0x3f800000;
      auVar60._24_4_ = 0x3f800000;
      auVar60._28_4_ = 0x3f800000;
      iVar14 = iVar18;
      while (bVar19 = iVar14 != 0, iVar14 = iVar14 + -1, bVar19) {
        auVar79 = *pauVar15;
        auVar26._8_4_ = 0x42b0c0a5;
        auVar26._0_8_ = 0x42b0c0a542b0c0a5;
        auVar26._12_4_ = 0x42b0c0a5;
        auVar26._16_4_ = 0x42b0c0a5;
        auVar26._20_4_ = 0x42b0c0a5;
        auVar26._24_4_ = 0x42b0c0a5;
        auVar26._28_4_ = 0x42b0c0a5;
        auVar55 = vminps_avx(auVar79,auVar26);
        auVar27._8_4_ = 0xc2b0c0a5;
        auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar27._12_4_ = 0xc2b0c0a5;
        auVar27._16_4_ = 0xc2b0c0a5;
        auVar27._20_4_ = 0xc2b0c0a5;
        auVar27._24_4_ = 0xc2b0c0a5;
        auVar27._28_4_ = 0xc2b0c0a5;
        auVar77 = vmaxps_avx(auVar55,auVar27);
        auVar166._8_4_ = 0x3fb8aa3b;
        auVar166._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar166._12_4_ = 0x3fb8aa3b;
        auVar166._16_4_ = 0x3fb8aa3b;
        auVar166._20_4_ = 0x3fb8aa3b;
        auVar166._24_4_ = 0x3fb8aa3b;
        auVar166._28_4_ = 0x3fb8aa3b;
        auVar28._8_4_ = 0x3f000000;
        auVar28._0_8_ = 0x3f0000003f000000;
        auVar28._12_4_ = 0x3f000000;
        auVar28._16_4_ = 0x3f000000;
        auVar28._20_4_ = 0x3f000000;
        auVar28._24_4_ = 0x3f000000;
        auVar28._28_4_ = 0x3f000000;
        auVar21 = vfmadd213ps_fma(auVar166,auVar77,auVar28);
        auVar4 = vroundps_avx(ZEXT1632(auVar21),1);
        auVar55 = vcmpps_avx(ZEXT1632(auVar21),auVar4,1);
        auVar55 = vandps_avx(auVar60,auVar55);
        auVar55 = vsubps_avx(auVar4,auVar55);
        auVar155._8_4_ = 0x3f317218;
        auVar155._0_8_ = 0x3f3172183f317218;
        auVar155._12_4_ = 0x3f317218;
        auVar155._16_4_ = 0x3f317218;
        auVar155._20_4_ = 0x3f317218;
        auVar155._24_4_ = 0x3f317218;
        auVar155._28_4_ = 0x3f317218;
        auVar52 = vfnmadd231ps_fma(auVar77,auVar55,auVar155);
        auVar38 = ZEXT1632(auVar52);
        fVar1 = auVar52._0_4_;
        fVar20 = auVar52._4_4_;
        fVar2 = auVar52._8_4_;
        fVar3 = auVar52._12_4_;
        auVar77._28_4_ = auVar4._28_4_;
        auVar77._0_28_ =
             ZEXT1628(CONCAT412(fVar3 * fVar3,
                                CONCAT48(fVar2 * fVar2,CONCAT44(fVar20 * fVar20,fVar1 * fVar1))));
        auVar148._8_4_ = 0x39506967;
        auVar148._0_8_ = 0x3950696739506967;
        auVar148._12_4_ = 0x39506967;
        auVar148._16_4_ = 0x39506967;
        auVar148._20_4_ = 0x39506967;
        auVar148._24_4_ = 0x39506967;
        auVar148._28_4_ = 0x39506967;
        auVar143._8_4_ = 0x3ab743ce;
        auVar143._0_8_ = 0x3ab743ce3ab743ce;
        auVar143._12_4_ = 0x3ab743ce;
        auVar143._16_4_ = 0x3ab743ce;
        auVar143._20_4_ = 0x3ab743ce;
        auVar143._24_4_ = 0x3ab743ce;
        auVar143._28_4_ = 0x3ab743ce;
        auVar21 = vfmadd213ps_fma(auVar148,auVar38,auVar143);
        auVar177._8_4_ = 0x3c088908;
        auVar177._0_8_ = 0x3c0889083c088908;
        auVar177._12_4_ = 0x3c088908;
        auVar177._16_4_ = 0x3c088908;
        auVar177._20_4_ = 0x3c088908;
        auVar177._24_4_ = 0x3c088908;
        auVar177._28_4_ = 0x3c088908;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar38,auVar177);
        auVar162._8_4_ = 0x3d2aa9c1;
        auVar162._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar162._12_4_ = 0x3d2aa9c1;
        auVar162._16_4_ = 0x3d2aa9c1;
        auVar162._20_4_ = 0x3d2aa9c1;
        auVar162._24_4_ = 0x3d2aa9c1;
        auVar162._28_4_ = 0x3d2aa9c1;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar38,auVar162);
        auVar170._8_4_ = 0x3e2aaaaa;
        auVar170._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar170._12_4_ = 0x3e2aaaaa;
        auVar170._16_4_ = 0x3e2aaaaa;
        auVar170._20_4_ = 0x3e2aaaaa;
        auVar170._24_4_ = 0x3e2aaaaa;
        auVar170._28_4_ = 0x3e2aaaaa;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar170);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar28);
        auVar39._0_4_ = fVar1 + 1.0;
        auVar39._4_4_ = fVar20 + 1.0;
        auVar39._8_4_ = fVar2 + 1.0;
        auVar39._12_4_ = fVar3 + 1.0;
        auVar39._16_4_ = 0x3f800000;
        auVar39._20_4_ = 0x3f800000;
        auVar39._24_4_ = 0x3f800000;
        auVar39._28_4_ = 0x3f800000;
        auVar21 = vfmadd231ps_fma(auVar39,auVar77,ZEXT1632(auVar21));
        auVar54._0_4_ = (int)auVar55._0_4_;
        auVar54._4_4_ = (int)auVar55._4_4_;
        auVar54._8_4_ = (int)auVar55._8_4_;
        auVar54._12_4_ = (int)auVar55._12_4_;
        auVar54._16_4_ = (int)auVar55._16_4_;
        auVar54._20_4_ = (int)auVar55._20_4_;
        auVar54._24_4_ = (int)auVar55._24_4_;
        auVar54._28_4_ = (int)auVar55._28_4_;
        auVar55 = vpslld_avx2(auVar54,0x17);
        auVar11._8_4_ = 0x3f800000;
        auVar11._0_8_ = 0x3f8000003f800000;
        auVar11._12_4_ = 0x3f800000;
        auVar11._16_4_ = 0x3f800000;
        auVar11._20_4_ = 0x3f800000;
        auVar11._24_4_ = 0x3f800000;
        auVar11._28_4_ = 0x3f800000;
        auVar55 = vpaddd_avx2(auVar11,auVar55);
        auVar21 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar21),auVar60);
        auVar40._8_4_ = 0x800000;
        auVar40._0_8_ = 0x80000000800000;
        auVar40._12_4_ = 0x800000;
        auVar40._16_4_ = 0x800000;
        auVar40._20_4_ = 0x800000;
        auVar40._24_4_ = 0x800000;
        auVar40._28_4_ = 0x800000;
        auVar55 = vmaxps_avx(ZEXT1632(auVar21),auVar40);
        auVar77 = vpsrld_avx2(auVar55,0x17);
        auVar55 = vandps_avx(auVar55,auVar25);
        auVar92._8_4_ = 0x3f000000;
        auVar92._0_8_ = 0x3f0000003f000000;
        auVar92._12_4_ = 0x3f000000;
        auVar92._16_4_ = 0x3f000000;
        auVar92._20_4_ = 0x3f000000;
        auVar92._24_4_ = 0x3f000000;
        auVar92._28_4_ = 0x3f000000;
        auVar4 = vorps_avx(auVar55,auVar92);
        auVar93._8_4_ = 0xffffff82;
        auVar93._0_8_ = 0xffffff82ffffff82;
        auVar93._12_4_ = 0xffffff82;
        auVar93._16_4_ = 0xffffff82;
        auVar93._20_4_ = 0xffffff82;
        auVar93._24_4_ = 0xffffff82;
        auVar93._28_4_ = 0xffffff82;
        auVar38 = vpaddd_avx2(auVar77,auVar93);
        auVar94._8_4_ = 0x3f3504f3;
        auVar94._0_8_ = 0x3f3504f33f3504f3;
        auVar94._12_4_ = 0x3f3504f3;
        auVar94._16_4_ = 0x3f3504f3;
        auVar94._20_4_ = 0x3f3504f3;
        auVar94._24_4_ = 0x3f3504f3;
        auVar94._28_4_ = 0x3f3504f3;
        auVar77 = vcmpps_avx(auVar4,auVar94,1);
        auVar55 = vandps_avx(auVar77,auVar4);
        auVar173._8_4_ = 0xbf800000;
        auVar173._0_8_ = 0xbf800000bf800000;
        auVar173._12_4_ = 0xbf800000;
        auVar173._16_4_ = 0xbf800000;
        auVar173._20_4_ = 0xbf800000;
        auVar173._24_4_ = 0xbf800000;
        auVar173._28_4_ = 0xbf800000;
        auVar41._0_4_ = auVar4._0_4_ + -1.0 + auVar55._0_4_;
        auVar41._4_4_ = auVar4._4_4_ + -1.0 + auVar55._4_4_;
        auVar41._8_4_ = auVar4._8_4_ + -1.0 + auVar55._8_4_;
        auVar41._12_4_ = auVar4._12_4_ + -1.0 + auVar55._12_4_;
        auVar41._16_4_ = auVar4._16_4_ + -1.0 + auVar55._16_4_;
        auVar41._20_4_ = auVar4._20_4_ + -1.0 + auVar55._20_4_;
        auVar41._24_4_ = auVar4._24_4_ + -1.0 + auVar55._24_4_;
        auVar41._28_4_ = auVar4._28_4_ + -1.0 + auVar55._28_4_;
        auVar4 = vcmpps_avx(ZEXT1632(auVar21),_DAT_002d8760,2);
        auVar38 = vcvtdq2ps_avx(auVar38);
        auVar55 = vandps_avx(auVar60,auVar77);
        auVar55 = vsubps_avx(auVar38,auVar55);
        auVar95._8_4_ = 0x3d9021bb;
        auVar95._0_8_ = 0x3d9021bb3d9021bb;
        auVar95._12_4_ = 0x3d9021bb;
        auVar95._16_4_ = 0x3d9021bb;
        auVar95._20_4_ = 0x3d9021bb;
        auVar95._24_4_ = 0x3d9021bb;
        auVar95._28_4_ = 0x3d9021bb;
        auVar114._8_4_ = 0xbdebd1b8;
        auVar114._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar114._12_4_ = 0xbdebd1b8;
        auVar114._16_4_ = 0xbdebd1b8;
        auVar114._20_4_ = 0xbdebd1b8;
        auVar114._24_4_ = 0xbdebd1b8;
        auVar114._28_4_ = 0xbdebd1b8;
        auVar21 = vfmadd213ps_fma(auVar95,auVar41,auVar114);
        auVar115._8_4_ = 0x3def251a;
        auVar115._0_8_ = 0x3def251a3def251a;
        auVar115._12_4_ = 0x3def251a;
        auVar115._16_4_ = 0x3def251a;
        auVar115._20_4_ = 0x3def251a;
        auVar115._24_4_ = 0x3def251a;
        auVar115._28_4_ = 0x3def251a;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar41,auVar115);
        auVar116._8_4_ = 0xbdfe5d4f;
        auVar116._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar116._12_4_ = 0xbdfe5d4f;
        auVar116._16_4_ = 0xbdfe5d4f;
        auVar116._20_4_ = 0xbdfe5d4f;
        auVar116._24_4_ = 0xbdfe5d4f;
        auVar116._28_4_ = 0xbdfe5d4f;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar41,auVar116);
        auVar117._8_4_ = 0x3e11e9bf;
        auVar117._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar117._12_4_ = 0x3e11e9bf;
        auVar117._16_4_ = 0x3e11e9bf;
        auVar117._20_4_ = 0x3e11e9bf;
        auVar117._24_4_ = 0x3e11e9bf;
        auVar117._28_4_ = 0x3e11e9bf;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar41,auVar117);
        auVar118._8_4_ = 0xbe2aae50;
        auVar118._0_8_ = 0xbe2aae50be2aae50;
        auVar118._12_4_ = 0xbe2aae50;
        auVar118._16_4_ = 0xbe2aae50;
        auVar118._20_4_ = 0xbe2aae50;
        auVar118._24_4_ = 0xbe2aae50;
        auVar118._28_4_ = 0xbe2aae50;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar41,auVar118);
        auVar119._8_4_ = 0x3e4cceac;
        auVar119._0_8_ = 0x3e4cceac3e4cceac;
        auVar119._12_4_ = 0x3e4cceac;
        auVar119._16_4_ = 0x3e4cceac;
        auVar119._20_4_ = 0x3e4cceac;
        auVar119._24_4_ = 0x3e4cceac;
        auVar119._28_4_ = 0x3e4cceac;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar41,auVar119);
        auVar120._8_4_ = 0xbe7ffffc;
        auVar120._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar120._12_4_ = 0xbe7ffffc;
        auVar120._16_4_ = 0xbe7ffffc;
        auVar120._20_4_ = 0xbe7ffffc;
        auVar120._24_4_ = 0xbe7ffffc;
        auVar120._28_4_ = 0xbe7ffffc;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar41,auVar120);
        auVar121._8_4_ = 0x3eaaaaaa;
        auVar121._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar121._12_4_ = 0x3eaaaaaa;
        auVar121._16_4_ = 0x3eaaaaaa;
        auVar121._20_4_ = 0x3eaaaaaa;
        auVar121._24_4_ = 0x3eaaaaaa;
        auVar121._28_4_ = 0x3eaaaaaa;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar41,auVar121);
        auVar52 = vfmsub213ps_fma(ZEXT1632(auVar21),auVar41,auVar28);
        auVar21 = vfmadd213ps_fma(auVar55,auVar155,auVar41);
        auVar55._4_4_ = auVar41._4_4_ * auVar41._4_4_;
        auVar55._0_4_ = auVar41._0_4_ * auVar41._0_4_;
        auVar55._8_4_ = auVar41._8_4_ * auVar41._8_4_;
        auVar55._12_4_ = auVar41._12_4_ * auVar41._12_4_;
        auVar55._16_4_ = auVar41._16_4_ * auVar41._16_4_;
        auVar55._20_4_ = auVar41._20_4_ * auVar41._20_4_;
        auVar55._24_4_ = auVar41._24_4_ * auVar41._24_4_;
        auVar55._28_4_ = auVar41._28_4_;
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar55,ZEXT1632(auVar52));
        auVar122._8_4_ = 0xc0000000;
        auVar122._0_8_ = 0xc0000000c0000000;
        auVar122._12_4_ = 0xc0000000;
        auVar122._16_4_ = 0xc0000000;
        auVar122._20_4_ = 0xc0000000;
        auVar122._24_4_ = 0xc0000000;
        auVar122._28_4_ = 0xc0000000;
        auVar38._4_4_ = auVar21._4_4_ * -2.0;
        auVar38._0_4_ = auVar21._0_4_ * -2.0;
        auVar38._8_4_ = auVar21._8_4_ * -2.0;
        auVar38._12_4_ = auVar21._12_4_ * -2.0;
        auVar38._16_4_ = 0x80000000;
        auVar38._20_4_ = 0x80000000;
        auVar38._24_4_ = 0x80000000;
        auVar38._28_4_ = auVar41._28_4_;
        auVar78._8_4_ = 0x7fffffff;
        auVar78._0_8_ = 0x7fffffff7fffffff;
        auVar78._12_4_ = 0x7fffffff;
        auVar78._16_4_ = 0x7fffffff;
        auVar78._20_4_ = 0x7fffffff;
        auVar78._24_4_ = 0x7fffffff;
        auVar78._28_4_ = 0x7fffffff;
        auVar55 = vblendvps_avx(auVar38,auVar78,auVar4);
        auVar56._8_4_ = 0x42b0c0a5;
        auVar56._0_8_ = 0x42b0c0a542b0c0a5;
        auVar56._12_4_ = 0x42b0c0a5;
        auVar56._16_4_ = 0x42b0c0a5;
        auVar56._20_4_ = 0x42b0c0a5;
        auVar56._24_4_ = 0x42b0c0a5;
        auVar56._28_4_ = 0x42b0c0a5;
        auVar55 = vminps_avx(auVar55,auVar56);
        auVar57._8_4_ = 0xc2b0c0a5;
        auVar57._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar57._12_4_ = 0xc2b0c0a5;
        auVar57._16_4_ = 0xc2b0c0a5;
        auVar57._20_4_ = 0xc2b0c0a5;
        auVar57._24_4_ = 0xc2b0c0a5;
        auVar57._28_4_ = 0xc2b0c0a5;
        auVar77 = vmaxps_avx(auVar55,auVar57);
        auVar21 = vfmadd213ps_fma(auVar166,auVar77,auVar28);
        auVar4 = vroundps_avx(ZEXT1632(auVar21),1);
        auVar55 = vcmpps_avx(ZEXT1632(auVar21),auVar4,1);
        auVar55 = vandps_avx(auVar60,auVar55);
        auVar55 = vsubps_avx(auVar4,auVar55);
        auVar52 = vfnmadd231ps_fma(auVar77,auVar55,auVar155);
        auVar77 = ZEXT1632(auVar52);
        fVar1 = auVar52._0_4_;
        fVar20 = auVar52._4_4_;
        fVar2 = auVar52._8_4_;
        fVar3 = auVar52._12_4_;
        auVar4._28_4_ = auVar4._28_4_;
        auVar4._0_28_ =
             ZEXT1628(CONCAT412(fVar3 * fVar3,
                                CONCAT48(fVar2 * fVar2,CONCAT44(fVar20 * fVar20,fVar1 * fVar1))));
        auVar21 = vfmadd213ps_fma(auVar148,auVar77,auVar143);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar77,auVar177);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar77,auVar162);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar170);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar28);
        auVar42._0_4_ = fVar1 + 1.0;
        auVar42._4_4_ = fVar20 + 1.0;
        auVar42._8_4_ = fVar2 + 1.0;
        auVar42._12_4_ = fVar3 + 1.0;
        auVar42._16_4_ = 0x3f800000;
        auVar42._20_4_ = 0x3f800000;
        auVar42._24_4_ = 0x3f800000;
        auVar42._28_4_ = 0x3f800000;
        auVar21 = vfmadd231ps_fma(auVar42,auVar4,ZEXT1632(auVar21));
        auVar58._0_4_ = (int)auVar55._0_4_;
        auVar58._4_4_ = (int)auVar55._4_4_;
        auVar58._8_4_ = (int)auVar55._8_4_;
        auVar58._12_4_ = (int)auVar55._12_4_;
        auVar58._16_4_ = (int)auVar55._16_4_;
        auVar58._20_4_ = (int)auVar55._20_4_;
        auVar58._24_4_ = (int)auVar55._24_4_;
        auVar58._28_4_ = (int)auVar55._28_4_;
        auVar55 = vpslld_avx2(auVar58,0x17);
        auVar55 = vpaddd_avx2(auVar11,auVar55);
        auVar21 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar21),auVar60);
        auVar55 = vrcpps_avx(ZEXT1632(auVar21));
        auVar21 = vfmsub213ps_fma(ZEXT1632(auVar21),auVar55,auVar60);
        auVar21 = vfnmadd132ps_fma(ZEXT1632(auVar21),auVar55,auVar55);
        auVar21 = vfnmadd213ps_fma(ZEXT1632(auVar21),auVar122,auVar173);
        local_d8 = auVar79._0_4_;
        fStack_d4 = auVar79._4_4_;
        fStack_d0 = auVar79._8_4_;
        fStack_cc = auVar79._12_4_;
        fStack_c8 = auVar79._16_4_;
        fStack_c4 = auVar79._20_4_;
        fStack_c0 = auVar79._24_4_;
        auVar79._4_4_ = auVar21._4_4_ * fStack_d4;
        auVar79._0_4_ = auVar21._0_4_ * local_d8;
        auVar79._8_4_ = auVar21._8_4_ * fStack_d0;
        auVar79._12_4_ = auVar21._12_4_ * fStack_cc;
        auVar79._16_4_ = fStack_c8 * 0.0;
        auVar79._20_4_ = fStack_c4 * 0.0;
        auVar79._24_4_ = fStack_c0 * 0.0;
        auVar79._28_4_ = 0x3f000000;
        *pauVar15 = auVar79;
        pauVar15 = pauVar15 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar18 < 1) {
      iVar18 = _c;
    }
    if (iVar16 < 1) {
      iVar16 = iVar14;
    }
    auVar21._8_4_ = 0x807fffff;
    auVar21._0_8_ = 0x807fffff807fffff;
    auVar21._12_4_ = 0x807fffff;
    for (; _c != iVar16; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar15 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar157._8_4_ = 0x3f800000;
      auVar157._0_8_ = 0x3f8000003f800000;
      auVar157._12_4_ = 0x3f800000;
      iVar14 = iVar18;
      while (bVar19 = iVar14 != 0, iVar14 = iVar14 + -1, bVar19) {
        auVar52 = *(undefined1 (*) [16])*pauVar15;
        auVar22._8_4_ = 0x42b0c0a5;
        auVar22._0_8_ = 0x42b0c0a542b0c0a5;
        auVar22._12_4_ = 0x42b0c0a5;
        auVar48 = vminps_avx(auVar52,auVar22);
        auVar23._8_4_ = 0xc2b0c0a5;
        auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar23._12_4_ = 0xc2b0c0a5;
        auVar53 = vmaxps_avx(auVar48,auVar23);
        auVar164._8_4_ = 0x3fb8aa3b;
        auVar164._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar164._12_4_ = 0x3fb8aa3b;
        auVar24._8_4_ = 0x3f000000;
        auVar24._0_8_ = 0x3f0000003f000000;
        auVar24._12_4_ = 0x3f000000;
        auVar48 = vfmadd213ps_fma(auVar164,auVar53,auVar24);
        auVar63._0_4_ = (int)auVar48._0_4_;
        auVar63._4_4_ = (int)auVar48._4_4_;
        auVar63._8_4_ = (int)auVar48._8_4_;
        auVar63._12_4_ = (int)auVar48._12_4_;
        auVar65 = vcvtdq2ps_avx(auVar63);
        auVar48 = vcmpps_avx(auVar48,auVar65,1);
        auVar48 = vandps_avx(auVar157,auVar48);
        auVar48 = vsubps_avx(auVar65,auVar48);
        auVar153._8_4_ = 0x3f317218;
        auVar153._0_8_ = 0x3f3172183f317218;
        auVar153._12_4_ = 0x3f317218;
        auVar53 = vfnmadd231ps_fma(auVar53,auVar48,auVar153);
        fVar1 = auVar53._0_4_;
        auVar64._0_4_ = fVar1 * fVar1;
        fVar20 = auVar53._4_4_;
        auVar64._4_4_ = fVar20 * fVar20;
        fVar2 = auVar53._8_4_;
        auVar64._8_4_ = fVar2 * fVar2;
        fVar3 = auVar53._12_4_;
        auVar64._12_4_ = fVar3 * fVar3;
        auVar146._8_4_ = 0x39506967;
        auVar146._0_8_ = 0x3950696739506967;
        auVar146._12_4_ = 0x39506967;
        auVar132._8_4_ = 0x3ab743ce;
        auVar132._0_8_ = 0x3ab743ce3ab743ce;
        auVar132._12_4_ = 0x3ab743ce;
        auVar65 = vfmadd213ps_fma(auVar146,auVar53,auVar132);
        auVar175._8_4_ = 0x3c088908;
        auVar175._0_8_ = 0x3c0889083c088908;
        auVar175._12_4_ = 0x3c088908;
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar175);
        auVar160._8_4_ = 0x3d2aa9c1;
        auVar160._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar160._12_4_ = 0x3d2aa9c1;
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar160);
        auVar168._8_4_ = 0x3e2aaaaa;
        auVar168._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar168._12_4_ = 0x3e2aaaaa;
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar168);
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar24);
        auVar31._0_4_ = fVar1 + 1.0;
        auVar31._4_4_ = fVar20 + 1.0;
        auVar31._8_4_ = fVar2 + 1.0;
        auVar31._12_4_ = fVar3 + 1.0;
        auVar65 = vfmadd231ps_fma(auVar31,auVar64,auVar65);
        auVar47._0_4_ = (int)auVar48._0_4_;
        auVar47._4_4_ = (int)auVar48._4_4_;
        auVar47._8_4_ = (int)auVar48._8_4_;
        auVar47._12_4_ = (int)auVar48._12_4_;
        auVar48 = vpslld_avx(auVar47,0x17);
        auVar10._8_4_ = 0x3f800000;
        auVar10._0_8_ = 0x3f8000003f800000;
        auVar10._12_4_ = 0x3f800000;
        auVar48 = vpaddd_avx(auVar10,auVar48);
        auVar37 = vfmadd213ps_fma(auVar48,auVar65,auVar157);
        auVar32._8_4_ = 0x800000;
        auVar32._0_8_ = 0x80000000800000;
        auVar32._12_4_ = 0x800000;
        auVar48 = vmaxps_avx(auVar37,auVar32);
        auVar65 = vpsrld_avx(auVar48,0x17);
        auVar48 = vandps_avx(auVar48,auVar21);
        auVar81._8_4_ = 0x3f000000;
        auVar81._0_8_ = 0x3f0000003f000000;
        auVar81._12_4_ = 0x3f000000;
        auVar100._8_4_ = 0xffffff82;
        auVar100._0_8_ = 0xffffff82ffffff82;
        auVar100._12_4_ = 0xffffff82;
        auVar53 = vorps_avx(auVar48,auVar81);
        auVar70 = vpaddd_avx(auVar65,auVar100);
        auVar82._8_4_ = 0x3f3504f3;
        auVar82._0_8_ = 0x3f3504f33f3504f3;
        auVar82._12_4_ = 0x3f3504f3;
        auVar65 = vcmpps_avx(auVar53,auVar82,1);
        auVar48 = vandps_avx(auVar65,auVar53);
        auVar33._0_4_ = auVar53._0_4_ + -1.0 + auVar48._0_4_;
        auVar33._4_4_ = auVar53._4_4_ + -1.0 + auVar48._4_4_;
        auVar33._8_4_ = auVar53._8_4_ + -1.0 + auVar48._8_4_;
        auVar33._12_4_ = auVar53._12_4_ + -1.0 + auVar48._12_4_;
        auVar53 = vcmpps_avx(auVar37,_DAT_002d6010,2);
        auVar70 = vcvtdq2ps_avx(auVar70);
        auVar48 = vandps_avx(auVar157,auVar65);
        auVar48 = vsubps_avx(auVar70,auVar48);
        auVar83._8_4_ = 0x3d9021bb;
        auVar83._0_8_ = 0x3d9021bb3d9021bb;
        auVar83._12_4_ = 0x3d9021bb;
        auVar101._8_4_ = 0xbdebd1b8;
        auVar101._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar101._12_4_ = 0xbdebd1b8;
        auVar65 = vfmadd213ps_fma(auVar83,auVar33,auVar101);
        auVar102._8_4_ = 0x3def251a;
        auVar102._0_8_ = 0x3def251a3def251a;
        auVar102._12_4_ = 0x3def251a;
        auVar65 = vfmadd213ps_fma(auVar65,auVar33,auVar102);
        auVar103._8_4_ = 0xbdfe5d4f;
        auVar103._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar103._12_4_ = 0xbdfe5d4f;
        auVar65 = vfmadd213ps_fma(auVar65,auVar33,auVar103);
        auVar104._8_4_ = 0x3e11e9bf;
        auVar104._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar104._12_4_ = 0x3e11e9bf;
        auVar65 = vfmadd213ps_fma(auVar65,auVar33,auVar104);
        auVar105._8_4_ = 0xbe2aae50;
        auVar105._0_8_ = 0xbe2aae50be2aae50;
        auVar105._12_4_ = 0xbe2aae50;
        auVar65 = vfmadd213ps_fma(auVar65,auVar33,auVar105);
        auVar106._8_4_ = 0x3e4cceac;
        auVar106._0_8_ = 0x3e4cceac3e4cceac;
        auVar106._12_4_ = 0x3e4cceac;
        auVar65 = vfmadd213ps_fma(auVar65,auVar33,auVar106);
        auVar107._8_4_ = 0xbe7ffffc;
        auVar107._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar107._12_4_ = 0xbe7ffffc;
        auVar65 = vfmadd213ps_fma(auVar65,auVar33,auVar107);
        auVar108._8_4_ = 0x3eaaaaaa;
        auVar108._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar108._12_4_ = 0x3eaaaaaa;
        auVar65 = vfmadd213ps_fma(auVar65,auVar33,auVar108);
        auVar65 = vfmsub213ps_fma(auVar65,auVar33,auVar24);
        auVar48 = vfmadd213ps_fma(auVar48,auVar153,auVar33);
        auVar34._0_4_ = auVar33._0_4_ * auVar33._0_4_;
        auVar34._4_4_ = auVar33._4_4_ * auVar33._4_4_;
        auVar34._8_4_ = auVar33._8_4_ * auVar33._8_4_;
        auVar34._12_4_ = auVar33._12_4_ * auVar33._12_4_;
        auVar48 = vfmadd231ps_fma(auVar48,auVar34,auVar65);
        auVar35._0_4_ = auVar48._0_4_ * -2.0;
        auVar35._4_4_ = auVar48._4_4_ * -2.0;
        auVar35._8_4_ = auVar48._8_4_ * -2.0;
        auVar35._12_4_ = auVar48._12_4_ * -2.0;
        auVar66._8_4_ = 0x7fffffff;
        auVar66._0_8_ = 0x7fffffff7fffffff;
        auVar66._12_4_ = 0x7fffffff;
        auVar48 = vblendvps_avx(auVar35,auVar66,auVar53);
        auVar49._8_4_ = 0x42b0c0a5;
        auVar49._0_8_ = 0x42b0c0a542b0c0a5;
        auVar49._12_4_ = 0x42b0c0a5;
        auVar48 = vminps_avx(auVar48,auVar49);
        auVar50._8_4_ = 0xc2b0c0a5;
        auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar50._12_4_ = 0xc2b0c0a5;
        auVar53 = vmaxps_avx(auVar48,auVar50);
        auVar48 = vfmadd213ps_fma(auVar164,auVar53,auVar24);
        auVar67._0_4_ = (int)auVar48._0_4_;
        auVar67._4_4_ = (int)auVar48._4_4_;
        auVar67._8_4_ = (int)auVar48._8_4_;
        auVar67._12_4_ = (int)auVar48._12_4_;
        auVar65 = vcvtdq2ps_avx(auVar67);
        auVar48 = vcmpps_avx(auVar48,auVar65,1);
        auVar48 = vandps_avx(auVar157,auVar48);
        auVar48 = vsubps_avx(auVar65,auVar48);
        auVar53 = vfnmadd231ps_fma(auVar53,auVar48,auVar153);
        fVar1 = auVar53._0_4_;
        auVar68._0_4_ = fVar1 * fVar1;
        fVar20 = auVar53._4_4_;
        auVar68._4_4_ = fVar20 * fVar20;
        fVar2 = auVar53._8_4_;
        auVar68._8_4_ = fVar2 * fVar2;
        fVar3 = auVar53._12_4_;
        auVar68._12_4_ = fVar3 * fVar3;
        auVar65 = vfmadd213ps_fma(auVar146,auVar53,auVar132);
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar175);
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar160);
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar168);
        auVar65 = vfmadd213ps_fma(auVar65,auVar53,auVar24);
        auVar36._0_4_ = fVar1 + 1.0;
        auVar36._4_4_ = fVar20 + 1.0;
        auVar36._8_4_ = fVar2 + 1.0;
        auVar36._12_4_ = fVar3 + 1.0;
        auVar65 = vfmadd231ps_fma(auVar36,auVar68,auVar65);
        auVar51._0_4_ = (int)auVar48._0_4_;
        auVar51._4_4_ = (int)auVar48._4_4_;
        auVar51._8_4_ = (int)auVar48._8_4_;
        auVar51._12_4_ = (int)auVar48._12_4_;
        auVar48 = vpslld_avx(auVar51,0x17);
        auVar48 = vpaddd_avx(auVar10,auVar48);
        auVar65 = vfmadd213ps_fma(auVar48,auVar65,auVar157);
        auVar48 = vrcpps_avx(auVar65);
        auVar69._0_4_ = auVar48._0_4_ + auVar48._0_4_;
        auVar69._4_4_ = auVar48._4_4_ + auVar48._4_4_;
        auVar69._8_4_ = auVar48._8_4_ + auVar48._8_4_;
        auVar69._12_4_ = auVar48._12_4_ + auVar48._12_4_;
        auVar84._8_4_ = 0x40000000;
        auVar84._0_8_ = 0x4000000040000000;
        auVar84._12_4_ = 0x40000000;
        auVar65 = vfmsub213ps_fma(auVar65,auVar69,auVar84);
        auVar48 = vfnmadd213ps_fma(auVar65,auVar48,auVar69);
        auVar52 = vfmsub213ps_fma(auVar48,auVar52,auVar52);
        *(undefined1 (*) [16])*pauVar15 = auVar52;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
      }
    }
  }
  else {
    if (iVar16 < 1) {
      iVar16 = iVar14;
    }
    auVar29._8_4_ = 0x807fffff;
    auVar29._0_8_ = 0x807fffff807fffff;
    auVar29._12_4_ = 0x807fffff;
    auVar29._16_4_ = 0x807fffff;
    auVar29._20_4_ = 0x807fffff;
    auVar29._24_4_ = 0x807fffff;
    auVar29._28_4_ = 0x807fffff;
    for (; _c != iVar16; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar13 = local_78.data;
      Mat::~Mat(&local_78);
      lVar17 = 0;
      pauVar15 = (undefined1 (*) [32])pvVar13;
      for (iVar14 = 0; iVar14 + 7 < iVar18; iVar14 = iVar14 + 8) {
        auVar25 = *pauVar15;
        auVar30._8_4_ = 0x42b0c0a5;
        auVar30._0_8_ = 0x42b0c0a542b0c0a5;
        auVar30._12_4_ = 0x42b0c0a5;
        auVar30._16_4_ = 0x42b0c0a5;
        auVar30._20_4_ = 0x42b0c0a5;
        auVar30._24_4_ = 0x42b0c0a5;
        auVar30._28_4_ = 0x42b0c0a5;
        auVar60 = vminps_avx(auVar25,auVar30);
        auVar149._8_4_ = 0xc2b0c0a5;
        auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar149._12_4_ = 0xc2b0c0a5;
        auVar149._16_4_ = 0xc2b0c0a5;
        auVar149._20_4_ = 0xc2b0c0a5;
        auVar149._24_4_ = 0xc2b0c0a5;
        auVar149._28_4_ = 0xc2b0c0a5;
        auVar79 = vmaxps_avx(auVar60,auVar149);
        auVar152._8_4_ = 0x3fb8aa3b;
        auVar152._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar152._12_4_ = 0x3fb8aa3b;
        auVar152._16_4_ = 0x3fb8aa3b;
        auVar152._20_4_ = 0x3fb8aa3b;
        auVar152._24_4_ = 0x3fb8aa3b;
        auVar152._28_4_ = 0x3fb8aa3b;
        auVar156._8_4_ = 0x3f000000;
        auVar156._0_8_ = 0x3f0000003f000000;
        auVar156._12_4_ = 0x3f000000;
        auVar156._16_4_ = 0x3f000000;
        auVar156._20_4_ = 0x3f000000;
        auVar156._24_4_ = 0x3f000000;
        auVar156._28_4_ = 0x3f000000;
        auVar21 = vfmadd213ps_fma(auVar152,auVar79,auVar156);
        auVar55 = vroundps_avx(ZEXT1632(auVar21),1);
        auVar60 = vcmpps_avx(ZEXT1632(auVar21),auVar55,1);
        auVar159._8_4_ = 0x3f800000;
        auVar159._0_8_ = 0x3f8000003f800000;
        auVar159._12_4_ = 0x3f800000;
        auVar159._16_4_ = 0x3f800000;
        auVar159._20_4_ = 0x3f800000;
        auVar159._24_4_ = 0x3f800000;
        auVar159._28_4_ = 0x3f800000;
        auVar60 = vandps_avx(auVar159,auVar60);
        auVar60 = vsubps_avx(auVar55,auVar60);
        auVar163._8_4_ = 0x3f317218;
        auVar163._0_8_ = 0x3f3172183f317218;
        auVar163._12_4_ = 0x3f317218;
        auVar163._16_4_ = 0x3f317218;
        auVar163._20_4_ = 0x3f317218;
        auVar163._24_4_ = 0x3f317218;
        auVar163._28_4_ = 0x3f317218;
        auVar52 = vfnmadd231ps_fma(auVar79,auVar60,auVar163);
        auVar79 = ZEXT1632(auVar52);
        fVar1 = auVar52._0_4_;
        fVar20 = auVar52._4_4_;
        fVar2 = auVar52._8_4_;
        fVar3 = auVar52._12_4_;
        auVar5._28_4_ = auVar55._28_4_;
        auVar5._0_28_ =
             ZEXT1628(CONCAT412(fVar3 * fVar3,
                                CONCAT48(fVar2 * fVar2,CONCAT44(fVar20 * fVar20,fVar1 * fVar1))));
        auVar167._8_4_ = 0x39506967;
        auVar167._0_8_ = 0x3950696739506967;
        auVar167._12_4_ = 0x39506967;
        auVar167._16_4_ = 0x39506967;
        auVar167._20_4_ = 0x39506967;
        auVar167._24_4_ = 0x39506967;
        auVar167._28_4_ = 0x39506967;
        auVar171._8_4_ = 0x3ab743ce;
        auVar171._0_8_ = 0x3ab743ce3ab743ce;
        auVar171._12_4_ = 0x3ab743ce;
        auVar171._16_4_ = 0x3ab743ce;
        auVar171._20_4_ = 0x3ab743ce;
        auVar171._24_4_ = 0x3ab743ce;
        auVar171._28_4_ = 0x3ab743ce;
        auVar21 = vfmadd213ps_fma(auVar167,auVar79,auVar171);
        auVar174._8_4_ = 0x3c088908;
        auVar174._0_8_ = 0x3c0889083c088908;
        auVar174._12_4_ = 0x3c088908;
        auVar174._16_4_ = 0x3c088908;
        auVar174._20_4_ = 0x3c088908;
        auVar174._24_4_ = 0x3c088908;
        auVar174._28_4_ = 0x3c088908;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar79,auVar174);
        auVar178._8_4_ = 0x3d2aa9c1;
        auVar178._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar178._12_4_ = 0x3d2aa9c1;
        auVar178._16_4_ = 0x3d2aa9c1;
        auVar178._20_4_ = 0x3d2aa9c1;
        auVar178._24_4_ = 0x3d2aa9c1;
        auVar178._28_4_ = 0x3d2aa9c1;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar79,auVar178);
        auVar144._8_4_ = 0x3e2aaaaa;
        auVar144._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar144._12_4_ = 0x3e2aaaaa;
        auVar144._16_4_ = 0x3e2aaaaa;
        auVar144._20_4_ = 0x3e2aaaaa;
        auVar144._24_4_ = 0x3e2aaaaa;
        auVar144._28_4_ = 0x3e2aaaaa;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar144);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar156);
        auVar43._0_4_ = fVar1 + 1.0;
        auVar43._4_4_ = fVar20 + 1.0;
        auVar43._8_4_ = fVar2 + 1.0;
        auVar43._12_4_ = fVar3 + 1.0;
        auVar43._16_4_ = 0x3f800000;
        auVar43._20_4_ = 0x3f800000;
        auVar43._24_4_ = 0x3f800000;
        auVar43._28_4_ = 0x3f800000;
        auVar21 = vfmadd231ps_fma(auVar43,auVar5,ZEXT1632(auVar21));
        auVar59._0_4_ = (int)auVar60._0_4_;
        auVar59._4_4_ = (int)auVar60._4_4_;
        auVar59._8_4_ = (int)auVar60._8_4_;
        auVar59._12_4_ = (int)auVar60._12_4_;
        auVar59._16_4_ = (int)auVar60._16_4_;
        auVar59._20_4_ = (int)auVar60._20_4_;
        auVar59._24_4_ = (int)auVar60._24_4_;
        auVar59._28_4_ = (int)auVar60._28_4_;
        auVar60 = vpslld_avx2(auVar59,0x17);
        auVar12._8_4_ = 0x3f800000;
        auVar12._0_8_ = 0x3f8000003f800000;
        auVar12._12_4_ = 0x3f800000;
        auVar12._16_4_ = 0x3f800000;
        auVar12._20_4_ = 0x3f800000;
        auVar12._24_4_ = 0x3f800000;
        auVar12._28_4_ = 0x3f800000;
        auVar60 = vpaddd_avx2(auVar60,auVar12);
        auVar21 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar21),auVar159);
        auVar44._8_4_ = 0x800000;
        auVar44._0_8_ = 0x80000000800000;
        auVar44._12_4_ = 0x800000;
        auVar44._16_4_ = 0x800000;
        auVar44._20_4_ = 0x800000;
        auVar44._24_4_ = 0x800000;
        auVar44._28_4_ = 0x800000;
        auVar60 = vmaxps_avx(ZEXT1632(auVar21),auVar44);
        auVar79 = vpsrld_avx2(auVar60,0x17);
        auVar60 = vandps_avx(auVar60,auVar29);
        auVar96._8_4_ = 0x3f000000;
        auVar96._0_8_ = 0x3f0000003f000000;
        auVar96._12_4_ = 0x3f000000;
        auVar96._16_4_ = 0x3f000000;
        auVar96._20_4_ = 0x3f000000;
        auVar96._24_4_ = 0x3f000000;
        auVar96._28_4_ = 0x3f000000;
        auVar55 = vorps_avx(auVar60,auVar96);
        auVar97._8_4_ = 0xffffff82;
        auVar97._0_8_ = 0xffffff82ffffff82;
        auVar97._12_4_ = 0xffffff82;
        auVar97._16_4_ = 0xffffff82;
        auVar97._20_4_ = 0xffffff82;
        auVar97._24_4_ = 0xffffff82;
        auVar97._28_4_ = 0xffffff82;
        auVar77 = vpaddd_avx2(auVar79,auVar97);
        auVar98._8_4_ = 0x3f3504f3;
        auVar98._0_8_ = 0x3f3504f33f3504f3;
        auVar98._12_4_ = 0x3f3504f3;
        auVar98._16_4_ = 0x3f3504f3;
        auVar98._20_4_ = 0x3f3504f3;
        auVar98._24_4_ = 0x3f3504f3;
        auVar98._28_4_ = 0x3f3504f3;
        auVar79 = vcmpps_avx(auVar55,auVar98,1);
        auVar60 = vandps_avx(auVar79,auVar55);
        auVar145._8_4_ = 0xbf800000;
        auVar145._0_8_ = 0xbf800000bf800000;
        auVar145._12_4_ = 0xbf800000;
        auVar145._16_4_ = 0xbf800000;
        auVar145._20_4_ = 0xbf800000;
        auVar145._24_4_ = 0xbf800000;
        auVar145._28_4_ = 0xbf800000;
        auVar45._0_4_ = auVar55._0_4_ + -1.0 + auVar60._0_4_;
        auVar45._4_4_ = auVar55._4_4_ + -1.0 + auVar60._4_4_;
        auVar45._8_4_ = auVar55._8_4_ + -1.0 + auVar60._8_4_;
        auVar45._12_4_ = auVar55._12_4_ + -1.0 + auVar60._12_4_;
        auVar45._16_4_ = auVar55._16_4_ + -1.0 + auVar60._16_4_;
        auVar45._20_4_ = auVar55._20_4_ + -1.0 + auVar60._20_4_;
        auVar45._24_4_ = auVar55._24_4_ + -1.0 + auVar60._24_4_;
        auVar45._28_4_ = auVar55._28_4_ + -1.0 + auVar60._28_4_;
        auVar55 = vcmpps_avx(ZEXT1632(auVar21),_DAT_002d8760,2);
        auVar77 = vcvtdq2ps_avx(auVar77);
        auVar60 = vandps_avx(auVar159,auVar79);
        auVar60 = vsubps_avx(auVar77,auVar60);
        auVar99._8_4_ = 0x3d9021bb;
        auVar99._0_8_ = 0x3d9021bb3d9021bb;
        auVar99._12_4_ = 0x3d9021bb;
        auVar99._16_4_ = 0x3d9021bb;
        auVar99._20_4_ = 0x3d9021bb;
        auVar99._24_4_ = 0x3d9021bb;
        auVar99._28_4_ = 0x3d9021bb;
        auVar123._8_4_ = 0xbdebd1b8;
        auVar123._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar123._12_4_ = 0xbdebd1b8;
        auVar123._16_4_ = 0xbdebd1b8;
        auVar123._20_4_ = 0xbdebd1b8;
        auVar123._24_4_ = 0xbdebd1b8;
        auVar123._28_4_ = 0xbdebd1b8;
        auVar21 = vfmadd213ps_fma(auVar99,auVar45,auVar123);
        auVar124._8_4_ = 0x3def251a;
        auVar124._0_8_ = 0x3def251a3def251a;
        auVar124._12_4_ = 0x3def251a;
        auVar124._16_4_ = 0x3def251a;
        auVar124._20_4_ = 0x3def251a;
        auVar124._24_4_ = 0x3def251a;
        auVar124._28_4_ = 0x3def251a;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar45,auVar124);
        auVar125._8_4_ = 0xbdfe5d4f;
        auVar125._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar125._12_4_ = 0xbdfe5d4f;
        auVar125._16_4_ = 0xbdfe5d4f;
        auVar125._20_4_ = 0xbdfe5d4f;
        auVar125._24_4_ = 0xbdfe5d4f;
        auVar125._28_4_ = 0xbdfe5d4f;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar45,auVar125);
        auVar126._8_4_ = 0x3e11e9bf;
        auVar126._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar126._12_4_ = 0x3e11e9bf;
        auVar126._16_4_ = 0x3e11e9bf;
        auVar126._20_4_ = 0x3e11e9bf;
        auVar126._24_4_ = 0x3e11e9bf;
        auVar126._28_4_ = 0x3e11e9bf;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar45,auVar126);
        auVar127._8_4_ = 0xbe2aae50;
        auVar127._0_8_ = 0xbe2aae50be2aae50;
        auVar127._12_4_ = 0xbe2aae50;
        auVar127._16_4_ = 0xbe2aae50;
        auVar127._20_4_ = 0xbe2aae50;
        auVar127._24_4_ = 0xbe2aae50;
        auVar127._28_4_ = 0xbe2aae50;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar45,auVar127);
        auVar128._8_4_ = 0x3e4cceac;
        auVar128._0_8_ = 0x3e4cceac3e4cceac;
        auVar128._12_4_ = 0x3e4cceac;
        auVar128._16_4_ = 0x3e4cceac;
        auVar128._20_4_ = 0x3e4cceac;
        auVar128._24_4_ = 0x3e4cceac;
        auVar128._28_4_ = 0x3e4cceac;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar45,auVar128);
        auVar129._8_4_ = 0xbe7ffffc;
        auVar129._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar129._12_4_ = 0xbe7ffffc;
        auVar129._16_4_ = 0xbe7ffffc;
        auVar129._20_4_ = 0xbe7ffffc;
        auVar129._24_4_ = 0xbe7ffffc;
        auVar129._28_4_ = 0xbe7ffffc;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar45,auVar129);
        auVar130._8_4_ = 0x3eaaaaaa;
        auVar130._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar130._12_4_ = 0x3eaaaaaa;
        auVar130._16_4_ = 0x3eaaaaaa;
        auVar130._20_4_ = 0x3eaaaaaa;
        auVar130._24_4_ = 0x3eaaaaaa;
        auVar130._28_4_ = 0x3eaaaaaa;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar45,auVar130);
        auVar52 = vfmsub213ps_fma(ZEXT1632(auVar21),auVar45,auVar156);
        auVar21 = vfmadd213ps_fma(auVar60,auVar163,auVar45);
        auVar6._4_4_ = auVar45._4_4_ * auVar45._4_4_;
        auVar6._0_4_ = auVar45._0_4_ * auVar45._0_4_;
        auVar6._8_4_ = auVar45._8_4_ * auVar45._8_4_;
        auVar6._12_4_ = auVar45._12_4_ * auVar45._12_4_;
        auVar6._16_4_ = auVar45._16_4_ * auVar45._16_4_;
        auVar6._20_4_ = auVar45._20_4_ * auVar45._20_4_;
        auVar6._24_4_ = auVar45._24_4_ * auVar45._24_4_;
        auVar6._28_4_ = auVar45._28_4_;
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar6,ZEXT1632(auVar52));
        auVar131._8_4_ = 0xc0000000;
        auVar131._0_8_ = 0xc0000000c0000000;
        auVar131._12_4_ = 0xc0000000;
        auVar131._16_4_ = 0xc0000000;
        auVar131._20_4_ = 0xc0000000;
        auVar131._24_4_ = 0xc0000000;
        auVar131._28_4_ = 0xc0000000;
        auVar7._4_4_ = auVar21._4_4_ * -2.0;
        auVar7._0_4_ = auVar21._0_4_ * -2.0;
        auVar7._8_4_ = auVar21._8_4_ * -2.0;
        auVar7._12_4_ = auVar21._12_4_ * -2.0;
        auVar7._16_4_ = 0x80000000;
        auVar7._20_4_ = 0x80000000;
        auVar7._24_4_ = 0x80000000;
        auVar7._28_4_ = auVar45._28_4_;
        auVar80._8_4_ = 0x7fffffff;
        auVar80._0_8_ = 0x7fffffff7fffffff;
        auVar80._12_4_ = 0x7fffffff;
        auVar80._16_4_ = 0x7fffffff;
        auVar80._20_4_ = 0x7fffffff;
        auVar80._24_4_ = 0x7fffffff;
        auVar80._28_4_ = 0x7fffffff;
        auVar60 = vblendvps_avx(auVar7,auVar80,auVar55);
        auVar61._8_4_ = 0x42b0c0a5;
        auVar61._0_8_ = 0x42b0c0a542b0c0a5;
        auVar61._12_4_ = 0x42b0c0a5;
        auVar61._16_4_ = 0x42b0c0a5;
        auVar61._20_4_ = 0x42b0c0a5;
        auVar61._24_4_ = 0x42b0c0a5;
        auVar61._28_4_ = 0x42b0c0a5;
        auVar60 = vminps_avx(auVar60,auVar61);
        auVar79 = vmaxps_avx(auVar60,auVar149);
        auVar21 = vfmadd213ps_fma(auVar152,auVar79,auVar156);
        auVar55 = vroundps_avx(ZEXT1632(auVar21),1);
        auVar60 = vcmpps_avx(ZEXT1632(auVar21),auVar55,1);
        auVar60 = vandps_avx(auVar159,auVar60);
        auVar60 = vsubps_avx(auVar55,auVar60);
        auVar52 = vfnmadd231ps_fma(auVar79,auVar60,auVar163);
        auVar79 = ZEXT1632(auVar52);
        fVar1 = auVar52._0_4_;
        fVar20 = auVar52._4_4_;
        fVar2 = auVar52._8_4_;
        fVar3 = auVar52._12_4_;
        auVar8._28_4_ = auVar55._28_4_;
        auVar8._0_28_ =
             ZEXT1628(CONCAT412(fVar3 * fVar3,
                                CONCAT48(fVar2 * fVar2,CONCAT44(fVar20 * fVar20,fVar1 * fVar1))));
        auVar21 = vfmadd213ps_fma(auVar167,auVar79,auVar171);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar79,auVar174);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar79,auVar178);
        auVar150._8_4_ = 0x3e2aaaaa;
        auVar150._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar150._12_4_ = 0x3e2aaaaa;
        auVar150._16_4_ = 0x3e2aaaaa;
        auVar150._20_4_ = 0x3e2aaaaa;
        auVar150._24_4_ = 0x3e2aaaaa;
        auVar150._28_4_ = 0x3e2aaaaa;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar150);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar52),auVar156);
        auVar46._0_4_ = fVar1 + 1.0;
        auVar46._4_4_ = fVar20 + 1.0;
        auVar46._8_4_ = fVar2 + 1.0;
        auVar46._12_4_ = fVar3 + 1.0;
        auVar46._16_4_ = 0x3f800000;
        auVar46._20_4_ = 0x3f800000;
        auVar46._24_4_ = 0x3f800000;
        auVar46._28_4_ = 0x3f800000;
        auVar21 = vfmadd231ps_fma(auVar46,auVar8,ZEXT1632(auVar21));
        auVar62._0_4_ = (int)auVar60._0_4_;
        auVar62._4_4_ = (int)auVar60._4_4_;
        auVar62._8_4_ = (int)auVar60._8_4_;
        auVar62._12_4_ = (int)auVar60._12_4_;
        auVar62._16_4_ = (int)auVar60._16_4_;
        auVar62._20_4_ = (int)auVar60._20_4_;
        auVar62._24_4_ = (int)auVar60._24_4_;
        auVar62._28_4_ = (int)auVar60._28_4_;
        auVar60 = vpslld_avx2(auVar62,0x17);
        auVar60 = vpaddd_avx2(auVar60,auVar12);
        auVar21 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar21),auVar159);
        auVar60 = vrcpps_avx(ZEXT1632(auVar21));
        auVar21 = vfmsub213ps_fma(ZEXT1632(auVar21),auVar60,auVar159);
        auVar21 = vfnmadd132ps_fma(ZEXT1632(auVar21),auVar60,auVar60);
        auVar21 = vfnmadd213ps_fma(ZEXT1632(auVar21),auVar131,auVar145);
        local_d8 = auVar25._0_4_;
        fStack_d4 = auVar25._4_4_;
        fStack_d0 = auVar25._8_4_;
        fStack_cc = auVar25._12_4_;
        fStack_c8 = auVar25._16_4_;
        fStack_c4 = auVar25._20_4_;
        fStack_c0 = auVar25._24_4_;
        auVar9._4_4_ = auVar21._4_4_ * fStack_d4;
        auVar9._0_4_ = auVar21._0_4_ * local_d8;
        auVar9._8_4_ = auVar21._8_4_ * fStack_d0;
        auVar9._12_4_ = auVar21._12_4_ * fStack_cc;
        auVar9._16_4_ = fStack_c8 * 0.0;
        auVar9._20_4_ = fStack_c4 * 0.0;
        auVar9._24_4_ = fStack_c0 * 0.0;
        auVar9._28_4_ = 0x3f800000;
        *pauVar15 = auVar9;
        pauVar15 = pauVar15 + 1;
        lVar17 = lVar17 + 8;
      }
      for (; iVar14 + 3 < iVar18; iVar14 = iVar14 + 4) {
        auVar21 = *(undefined1 (*) [16])*pauVar15;
        auVar147._8_4_ = 0x42b0c0a5;
        auVar147._0_8_ = 0x42b0c0a542b0c0a5;
        auVar147._12_4_ = 0x42b0c0a5;
        auVar52 = vminps_avx(auVar21,auVar147);
        auVar151._8_4_ = 0xc2b0c0a5;
        auVar151._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar151._12_4_ = 0xc2b0c0a5;
        auVar65 = vmaxps_avx(auVar151,auVar52);
        auVar154._8_4_ = 0x3fb8aa3b;
        auVar154._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar154._12_4_ = 0x3fb8aa3b;
        auVar158._8_4_ = 0x3f000000;
        auVar158._0_8_ = 0x3f0000003f000000;
        auVar158._12_4_ = 0x3f000000;
        auVar52 = vfmadd213ps_fma(auVar154,auVar65,auVar158);
        auVar48._0_4_ = (int)auVar52._0_4_;
        auVar48._4_4_ = (int)auVar52._4_4_;
        auVar48._8_4_ = (int)auVar52._8_4_;
        auVar48._12_4_ = (int)auVar52._12_4_;
        auVar48 = vcvtdq2ps_avx(auVar48);
        auVar52 = vcmpps_avx(auVar52,auVar48,1);
        auVar161._8_4_ = 0x3f800000;
        auVar161._0_8_ = 0x3f8000003f800000;
        auVar161._12_4_ = 0x3f800000;
        auVar52 = vandps_avx(auVar161,auVar52);
        auVar52 = vsubps_avx(auVar48,auVar52);
        auVar165._8_4_ = 0x3f317218;
        auVar165._0_8_ = 0x3f3172183f317218;
        auVar165._12_4_ = 0x3f317218;
        auVar65 = vfnmadd231ps_fma(auVar65,auVar52,auVar165);
        fVar1 = auVar65._0_4_;
        auVar70._0_4_ = fVar1 * fVar1;
        fVar20 = auVar65._4_4_;
        auVar70._4_4_ = fVar20 * fVar20;
        fVar2 = auVar65._8_4_;
        auVar70._8_4_ = fVar2 * fVar2;
        fVar3 = auVar65._12_4_;
        auVar70._12_4_ = fVar3 * fVar3;
        auVar169._8_4_ = 0x39506967;
        auVar169._0_8_ = 0x3950696739506967;
        auVar169._12_4_ = 0x39506967;
        auVar172._8_4_ = 0x3ab743ce;
        auVar172._0_8_ = 0x3ab743ce3ab743ce;
        auVar172._12_4_ = 0x3ab743ce;
        auVar48 = vfmadd213ps_fma(auVar169,auVar65,auVar172);
        auVar176._8_4_ = 0x3c088908;
        auVar176._0_8_ = 0x3c0889083c088908;
        auVar176._12_4_ = 0x3c088908;
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar176);
        auVar109._8_4_ = 0x3d2aa9c1;
        auVar109._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar109._12_4_ = 0x3d2aa9c1;
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar109);
        auVar110._8_4_ = 0x3e2aaaaa;
        auVar110._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar110._12_4_ = 0x3e2aaaaa;
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar110);
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar158);
        auVar111._0_4_ = fVar1 + 1.0;
        auVar111._4_4_ = fVar20 + 1.0;
        auVar111._8_4_ = fVar2 + 1.0;
        auVar111._12_4_ = fVar3 + 1.0;
        auVar48 = vfmadd231ps_fma(auVar111,auVar70,auVar48);
        auVar65._0_4_ = (int)auVar52._0_4_;
        auVar65._4_4_ = (int)auVar52._4_4_;
        auVar65._8_4_ = (int)auVar52._8_4_;
        auVar65._12_4_ = (int)auVar52._12_4_;
        auVar52 = vpslld_avx(auVar65,0x17);
        auVar37._8_4_ = 0x3f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        auVar37._12_4_ = 0x3f800000;
        auVar52 = vpaddd_avx(auVar52,auVar37);
        auVar70 = vfmadd213ps_fma(auVar52,auVar48,auVar161);
        auVar52._8_4_ = 0x800000;
        auVar52._0_8_ = 0x80000000800000;
        auVar52._12_4_ = 0x800000;
        auVar52 = vmaxps_avx(auVar70,auVar52);
        auVar85._8_4_ = 0x807fffff;
        auVar85._0_8_ = 0x807fffff807fffff;
        auVar85._12_4_ = 0x807fffff;
        auVar48 = vpsrld_avx(auVar52,0x17);
        auVar52 = vandps_avx(auVar52,auVar85);
        auVar86._8_4_ = 0x3f000000;
        auVar86._0_8_ = 0x3f0000003f000000;
        auVar86._12_4_ = 0x3f000000;
        auVar65 = vorps_avx(auVar52,auVar86);
        auVar87._8_4_ = 0xffffff82;
        auVar87._0_8_ = 0xffffff82ffffff82;
        auVar87._12_4_ = 0xffffff82;
        auVar53 = vpaddd_avx(auVar48,auVar87);
        auVar112._8_4_ = 0x3f3504f3;
        auVar112._0_8_ = 0x3f3504f33f3504f3;
        auVar112._12_4_ = 0x3f3504f3;
        auVar48 = vcmpps_avx(auVar65,auVar112,1);
        auVar52 = vandps_avx(auVar48,auVar65);
        auVar71._0_4_ = auVar65._0_4_ + -1.0 + auVar52._0_4_;
        auVar71._4_4_ = auVar65._4_4_ + -1.0 + auVar52._4_4_;
        auVar71._8_4_ = auVar65._8_4_ + -1.0 + auVar52._8_4_;
        auVar71._12_4_ = auVar65._12_4_ + -1.0 + auVar52._12_4_;
        auVar65 = vcmpps_avx(auVar70,_DAT_002d6010,2);
        auVar53 = vcvtdq2ps_avx(auVar53);
        auVar52 = vandps_avx(auVar161,auVar48);
        auVar52 = vsubps_avx(auVar53,auVar52);
        auVar113._8_4_ = 0x3d9021bb;
        auVar113._0_8_ = 0x3d9021bb3d9021bb;
        auVar113._12_4_ = 0x3d9021bb;
        auVar133._8_4_ = 0xbdebd1b8;
        auVar133._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar133._12_4_ = 0xbdebd1b8;
        auVar48 = vfmadd213ps_fma(auVar113,auVar71,auVar133);
        auVar134._8_4_ = 0x3def251a;
        auVar134._0_8_ = 0x3def251a3def251a;
        auVar134._12_4_ = 0x3def251a;
        auVar48 = vfmadd213ps_fma(auVar48,auVar71,auVar134);
        auVar135._8_4_ = 0xbdfe5d4f;
        auVar135._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar135._12_4_ = 0xbdfe5d4f;
        auVar48 = vfmadd213ps_fma(auVar48,auVar71,auVar135);
        auVar136._8_4_ = 0x3e11e9bf;
        auVar136._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar136._12_4_ = 0x3e11e9bf;
        auVar48 = vfmadd213ps_fma(auVar48,auVar71,auVar136);
        auVar137._8_4_ = 0xbe2aae50;
        auVar137._0_8_ = 0xbe2aae50be2aae50;
        auVar137._12_4_ = 0xbe2aae50;
        auVar48 = vfmadd213ps_fma(auVar48,auVar71,auVar137);
        auVar138._8_4_ = 0x3e4cceac;
        auVar138._0_8_ = 0x3e4cceac3e4cceac;
        auVar138._12_4_ = 0x3e4cceac;
        auVar48 = vfmadd213ps_fma(auVar48,auVar71,auVar138);
        auVar139._8_4_ = 0xbe7ffffc;
        auVar139._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar139._12_4_ = 0xbe7ffffc;
        auVar48 = vfmadd213ps_fma(auVar48,auVar71,auVar139);
        auVar140._8_4_ = 0x3eaaaaaa;
        auVar140._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar140._12_4_ = 0x3eaaaaaa;
        auVar48 = vfmadd213ps_fma(auVar48,auVar71,auVar140);
        auVar48 = vfmsub213ps_fma(auVar48,auVar71,auVar158);
        auVar52 = vfmadd213ps_fma(auVar52,auVar165,auVar71);
        auVar72._0_4_ = auVar71._0_4_ * auVar71._0_4_;
        auVar72._4_4_ = auVar71._4_4_ * auVar71._4_4_;
        auVar72._8_4_ = auVar71._8_4_ * auVar71._8_4_;
        auVar72._12_4_ = auVar71._12_4_ * auVar71._12_4_;
        auVar52 = vfmadd231ps_fma(auVar52,auVar72,auVar48);
        auVar73._0_4_ = auVar52._0_4_ * -2.0;
        auVar73._4_4_ = auVar52._4_4_ * -2.0;
        auVar73._8_4_ = auVar52._8_4_ * -2.0;
        auVar73._12_4_ = auVar52._12_4_ * -2.0;
        auVar88._8_4_ = 0x7fffffff;
        auVar88._0_8_ = 0x7fffffff7fffffff;
        auVar88._12_4_ = 0x7fffffff;
        auVar52 = vblendvps_avx(auVar73,auVar88,auVar65);
        auVar74._8_4_ = 0x42b0c0a5;
        auVar74._0_8_ = 0x42b0c0a542b0c0a5;
        auVar74._12_4_ = 0x42b0c0a5;
        auVar52 = vminps_avx(auVar52,auVar74);
        auVar65 = vmaxps_avx(auVar151,auVar52);
        auVar52 = vfmadd213ps_fma(auVar154,auVar65,auVar158);
        auVar89._0_4_ = (int)auVar52._0_4_;
        auVar89._4_4_ = (int)auVar52._4_4_;
        auVar89._8_4_ = (int)auVar52._8_4_;
        auVar89._12_4_ = (int)auVar52._12_4_;
        auVar48 = vcvtdq2ps_avx(auVar89);
        auVar52 = vcmpps_avx(auVar52,auVar48,1);
        auVar52 = vandps_avx(auVar161,auVar52);
        auVar52 = vsubps_avx(auVar48,auVar52);
        auVar65 = vfnmadd231ps_fma(auVar65,auVar52,auVar165);
        fVar1 = auVar65._0_4_;
        auVar90._0_4_ = fVar1 * fVar1;
        fVar20 = auVar65._4_4_;
        auVar90._4_4_ = fVar20 * fVar20;
        fVar2 = auVar65._8_4_;
        auVar90._8_4_ = fVar2 * fVar2;
        fVar3 = auVar65._12_4_;
        auVar90._12_4_ = fVar3 * fVar3;
        auVar48 = vfmadd213ps_fma(auVar169,auVar65,auVar172);
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar176);
        auVar141._8_4_ = 0x3d2aa9c1;
        auVar141._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar141._12_4_ = 0x3d2aa9c1;
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar141);
        auVar142._8_4_ = 0x3e2aaaaa;
        auVar142._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar142._12_4_ = 0x3e2aaaaa;
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar142);
        auVar48 = vfmadd213ps_fma(auVar48,auVar65,auVar158);
        auVar53._0_4_ = fVar1 + 1.0;
        auVar53._4_4_ = fVar20 + 1.0;
        auVar53._8_4_ = fVar2 + 1.0;
        auVar53._12_4_ = fVar3 + 1.0;
        auVar48 = vfmadd231ps_fma(auVar53,auVar90,auVar48);
        auVar75._0_4_ = (int)auVar52._0_4_;
        auVar75._4_4_ = (int)auVar52._4_4_;
        auVar75._8_4_ = (int)auVar52._8_4_;
        auVar75._12_4_ = (int)auVar52._12_4_;
        auVar52 = vpslld_avx(auVar75,0x17);
        auVar52 = vpaddd_avx(auVar52,auVar37);
        auVar48 = vfmadd213ps_fma(auVar52,auVar48,auVar161);
        auVar52 = vrcpps_avx(auVar48);
        auVar76._0_4_ = auVar52._0_4_ + auVar52._0_4_;
        auVar76._4_4_ = auVar52._4_4_ + auVar52._4_4_;
        auVar76._8_4_ = auVar52._8_4_ + auVar52._8_4_;
        auVar76._12_4_ = auVar52._12_4_ + auVar52._12_4_;
        auVar91._8_4_ = 0x40000000;
        auVar91._0_8_ = 0x4000000040000000;
        auVar91._12_4_ = 0x40000000;
        auVar48 = vfmsub213ps_fma(auVar48,auVar76,auVar91);
        auVar52 = vfnmadd213ps_fma(auVar48,auVar52,auVar76);
        auVar21 = vfmsub213ps_fma(auVar52,auVar21,auVar21);
        *(undefined1 (*) [16])*pauVar15 = auVar21;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        lVar17 = lVar17 + 4;
      }
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar1 = *(float *)((undefined1 *)pvVar13 + lVar17 * 4);
        fVar20 = expf(fVar1);
        fVar20 = logf(fVar20 + 1.0);
        fVar20 = tanhf(fVar20);
        *(float *)((undefined1 *)pvVar13 + lVar17 * 4) = fVar20 * fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}